

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O2

int arkRwtSetSV(ARKodeMem ark_mem,N_Vector My,N_Vector weight)

{
  double dVar1;
  
  N_VAbs(My,ark_mem->tempv1);
  N_VLinearSum(ark_mem->reltol,ark_mem->tempv1,ark_mem->VRabstol,ark_mem->tempv1);
  if ((ark_mem->Ratolmin0 != 0) && (dVar1 = (double)N_VMin(ark_mem->tempv1), dVar1 <= 0.0)) {
    return -1;
  }
  N_VInv(ark_mem->tempv1,weight);
  return 0;
}

Assistant:

int arkRwtSetSV(ARKodeMem ark_mem, N_Vector My, N_Vector weight)
{
  N_VAbs(My, ark_mem->tempv1);
  N_VLinearSum(ark_mem->reltol, ark_mem->tempv1, ONE, ark_mem->VRabstol,
               ark_mem->tempv1);
  if (ark_mem->Ratolmin0)
  {
    if (N_VMin(ark_mem->tempv1) <= ZERO) { return (-1); }
  }
  N_VInv(ark_mem->tempv1, weight);
  return (0);
}